

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afshaper.c
# Opt level: O0

FT_ULong af_shaper_get_elem(AF_StyleMetrics_conflict metrics,void *buf_,uint idx,FT_Long *advance,
                           FT_Long *y_offset)

{
  long lVar1;
  uint local_54 [2];
  uint gcount;
  hb_glyph_position_t *gpos;
  hb_glyph_info_t *ginfo;
  hb_buffer_t *buf;
  FT_Long *y_offset_local;
  FT_Long *advance_local;
  void *pvStack_20;
  uint idx_local;
  void *buf__local;
  AF_StyleMetrics_conflict metrics_local;
  
  ginfo = (hb_glyph_info_t *)buf_;
  buf = (hb_buffer_t *)y_offset;
  y_offset_local = advance;
  advance_local._4_4_ = idx;
  pvStack_20 = buf_;
  buf__local = metrics;
  gpos = (hb_glyph_position_t *)hb_buffer_get_glyph_infos(buf_,local_54);
  lVar1 = hb_buffer_get_glyph_positions(ginfo,local_54);
  if (advance_local._4_4_ < local_54[0]) {
    if (y_offset_local != (FT_Long *)0x0) {
      *y_offset_local = (long)*(int *)(lVar1 + (ulong)advance_local._4_4_ * 0x14);
    }
    if (buf != (hb_buffer_t *)0x0) {
      *(long *)buf = (long)*(int *)(lVar1 + (ulong)advance_local._4_4_ * 0x14 + 0xc);
    }
    metrics_local = (AF_StyleMetrics_conflict)(ulong)(uint)gpos[advance_local._4_4_].x_advance;
  }
  else {
    metrics_local = (AF_StyleMetrics_conflict)0x0;
  }
  return (FT_ULong)metrics_local;
}

Assistant:

FT_ULong
  af_shaper_get_elem( AF_StyleMetrics  metrics,
                      void*            buf_,
                      unsigned int     idx,
                      FT_Long*         advance,
                      FT_Long*         y_offset )
  {
    hb_buffer_t*          buf = (hb_buffer_t*)buf_;
    hb_glyph_info_t*      ginfo;
    hb_glyph_position_t*  gpos;
    unsigned int          gcount;

    FT_UNUSED( metrics );


    ginfo = hb_buffer_get_glyph_infos( buf, &gcount );
    gpos  = hb_buffer_get_glyph_positions( buf, &gcount );

    if ( idx >= gcount )
      return 0;

    if ( advance )
      *advance = gpos[idx].x_advance;
    if ( y_offset )
      *y_offset = gpos[idx].y_offset;

    return ginfo[idx].codepoint;
  }